

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<std::array<double,2ul>>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,array<double,_2UL> *v)

{
  bool bVar1;
  value_type *pvVar2;
  optional<std::array<double,_2UL>_> local_a0;
  undefined1 local_88 [8];
  optional<std::array<double,_2UL>_> pv_1;
  optional<std::array<double,_2UL>_> local_68;
  undefined1 local_50 [8];
  optional<std::array<double,_2UL>_> pv;
  array<double,_2UL> *v_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  PrimVar *this_local;
  
  if (v == (array<double,_2UL> *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_002dc59c;
  }
  tinyusdz::value::TimeCode::TimeCode((TimeCode *)((long)&pv.contained + 8),t);
  bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)((long)&pv.contained + 8));
  if (bVar1) {
    get_default_value<std::array<double,2ul>>(&local_68,this);
    nonstd::optional_lite::optional<std::array<double,_2UL>_>::optional<std::array<double,_2UL>,_0>
              ((optional<std::array<double,_2UL>_> *)local_50,&local_68);
    nonstd::optional_lite::optional<std::array<double,_2UL>_>::~optional(&local_68);
    pv_1.contained._12_1_ =
         nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_50);
    if ((bool)pv_1.contained._12_1_) {
      pvVar2 = nonstd::optional_lite::optional<std::array<double,_2UL>_>::value
                         ((optional<std::array<double,_2UL>_> *)local_50);
      v->_M_elems[0] = pvVar2->_M_elems[0];
      v->_M_elems[1] = pvVar2->_M_elems[1];
      this_local._7_1_ = 1;
    }
    pv_1.contained._13_3_ = 0;
    nonstd::optional_lite::optional<std::array<double,_2UL>_>::~optional
              ((optional<std::array<double,_2UL>_> *)local_50);
    if (pv_1.contained._12_4_ != 0) goto LAB_002dc59c;
    bVar1 = tinyusdz::value::TimeSamples::empty(&this->_ts);
    if (bVar1) {
      this_local._7_1_ = 0;
      goto LAB_002dc59c;
    }
  }
  bVar1 = has_timesamples(this);
  if (bVar1) {
    this_local._7_1_ =
         tinyusdz::value::TimeSamples::get<std::array<double,_2UL>,_nullptr>(&this->_ts,v,t,tinterp)
    ;
  }
  else {
    bVar1 = has_default(this);
    if (bVar1) {
      get_default_value<std::array<double,2ul>>(&local_a0,this);
      nonstd::optional_lite::optional<std::array<double,_2UL>_>::
      optional<std::array<double,_2UL>,_0>((optional<std::array<double,_2UL>_> *)local_88,&local_a0)
      ;
      nonstd::optional_lite::optional<std::array<double,_2UL>_>::~optional(&local_a0);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_88);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<std::array<double,_2UL>_>::value
                           ((optional<std::array<double,_2UL>_> *)local_88);
        v->_M_elems[0] = pvVar2->_M_elems[0];
        v->_M_elems[1] = pvVar2->_M_elems[1];
        this_local._7_1_ = 1;
      }
      pv_1.contained._13_3_ = 0;
      pv_1.contained._12_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<double,_2UL>_>::~optional
                ((optional<std::array<double,_2UL>_> *)local_88);
      if (pv_1.contained._12_4_ != 0) goto LAB_002dc59c;
    }
    this_local._7_1_ = 0;
  }
LAB_002dc59c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }